

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferBase.hpp
# Opt level: O0

void __thiscall
Diligent::FramebufferBase<Diligent::EngineGLImplTraits>::~FramebufferBase
          (FramebufferBase<Diligent::EngineGLImplTraits> *this)

{
  uint uVar1;
  int iVar2;
  Char *Message;
  IMemoryAllocator *pIVar3;
  undefined4 extraout_var;
  uint local_3c;
  Uint32 i_1;
  Uint32 SubpassCount;
  Uint32 i;
  string msg;
  FramebufferBase<Diligent::EngineGLImplTraits> *this_local;
  
  (this->
  super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
  ).super_ObjectBase<Diligent::IFramebuffer>.super_RefCountedObject<Diligent::IFramebuffer>.
  super_IFramebuffer.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_0058f7a8;
  msg.field_2._8_8_ = this;
  if ((this->
      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ).m_Desc.AttachmentCount != 0) {
    if (this->m_ppAttachments == (ITextureView **)0x0) {
      FormatString<char[26],char[27]>
                ((string *)&SubpassCount,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_ppAttachments != nullptr",
                 (char (*) [27])&PTR_QueryInterface_0058f7a8);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"~FramebufferBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                 ,0xac);
      std::__cxx11::string::~string((string *)&SubpassCount);
    }
    for (i_1 = 0; i_1 < (this->
                        super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                        ).m_Desc.AttachmentCount; i_1 = i_1 + 1) {
      if (this->m_ppAttachments[i_1] != (ITextureView *)0x0) {
        (*(this->m_ppAttachments[i_1]->super_IDeviceObject).super_IObject._vptr_IObject[2])();
      }
    }
    pIVar3 = GetRawAllocator();
    (*pIVar3->_vptr_IMemoryAllocator[1])(pIVar3,this->m_ppAttachments);
  }
  if (this->m_ppReadOnlyDSVs != (ITextureView **)0x0) {
    iVar2 = (*(((this->
                super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                ).m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    uVar1 = *(uint *)(CONCAT44(extraout_var,iVar2) + 0x18);
    for (local_3c = 0; local_3c < uVar1; local_3c = local_3c + 1) {
      if (this->m_ppReadOnlyDSVs[local_3c] != (ITextureView *)0x0) {
        (*(this->m_ppReadOnlyDSVs[local_3c]->super_IDeviceObject).super_IObject._vptr_IObject[2])();
      }
    }
    pIVar3 = GetRawAllocator();
    (*pIVar3->_vptr_IMemoryAllocator[1])(pIVar3,this->m_ppReadOnlyDSVs);
  }
  (*(((this->
      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ).m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[2])();
  DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
  ::~DeviceObjectBase(&this->
                       super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                     );
  return;
}

Assistant:

~FramebufferBase()
    {
        if (this->m_Desc.AttachmentCount > 0)
        {
            VERIFY_EXPR(m_ppAttachments != nullptr);
            for (Uint32 i = 0; i < this->m_Desc.AttachmentCount; ++i)
            {
                if (m_ppAttachments[i] != nullptr)
                    m_ppAttachments[i]->Release();
            }
            GetRawAllocator().Free(m_ppAttachments);
        }

        if (m_ppReadOnlyDSVs != nullptr)
        {
            const auto SubpassCount = this->m_Desc.pRenderPass->GetDesc().SubpassCount;
            for (Uint32 i = 0; i < SubpassCount; ++i)
            {
                if (m_ppReadOnlyDSVs[i] != nullptr)
                    m_ppReadOnlyDSVs[i]->Release();
            }
            GetRawAllocator().Free(m_ppReadOnlyDSVs);
        }

        this->m_Desc.pRenderPass->Release();
    }